

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj2pbrt.cpp
# Opt level: O2

bool __thiscall
tinyobj::MaterialFileReader::operator()
          (MaterialFileReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *err)

{
  ostream *poVar1;
  string filepath;
  string local_3d0 [32];
  stringstream ss;
  ostream local_3a0 [376];
  ifstream matIStream;
  byte abStack_208 [488];
  
  filepath._M_dataplus._M_p = (pointer)&filepath.field_2;
  filepath._M_string_length = 0;
  filepath.field_2._M_local_buf[0] = '\0';
  if ((this->m_mtlBasePath)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&filepath);
  }
  else {
    std::__cxx11::string::string((string *)&ss,(string *)&this->m_mtlBasePath);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&matIStream,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,matId);
    std::__cxx11::string::operator=((string *)&filepath,(string *)&matIStream);
    std::__cxx11::string::~string((string *)&matIStream);
    std::__cxx11::string::~string((string *)&ss);
  }
  std::ifstream::ifstream(&matIStream,filepath._M_dataplus._M_p,_S_in);
  LoadMtl(matMap,materials,(istream *)&matIStream);
  if ((abStack_208[*(long *)(_matIStream + -0x18)] & 5) != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar1 = std::operator<<(local_3a0,"WARN: Material file [ ");
    poVar1 = std::operator<<(poVar1,(string *)&filepath);
    std::operator<<(poVar1," ] not found. Created a default material.");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)err);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  std::ifstream::~ifstream(&matIStream);
  std::__cxx11::string::~string((string *)&filepath);
  return true;
}

Assistant:

bool MaterialFileReader::operator()(const std::string &matId,
                                    std::vector<material_t> &materials,
                                    std::map<std::string, int> &matMap,
                                    std::string &err) {
  std::string filepath;

  if (!m_mtlBasePath.empty()) {
    filepath = std::string(m_mtlBasePath) + matId;
  } else {
    filepath = matId;
  }

  std::ifstream matIStream(filepath.c_str());
  LoadMtl(matMap, materials, matIStream);
  if (!matIStream) {
    std::stringstream ss;
    ss << "WARN: Material file [ " << filepath
       << " ] not found. Created a default material.";
    err += ss.str();
  }
  return true;
}